

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O3

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::
EncodeAttributeConnectivitiesOnFace
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *this,
          CornerIndex corner)

{
  ulong *puVar1;
  pointer pAVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  int c;
  long lVar7;
  uint local_3c [3];
  
  local_3c[0] = corner.value_;
  if (corner.value_ == 0xffffffff) {
    local_3c[1] = -1;
    local_3c[2] = -1;
  }
  else {
    local_3c[1] = corner.value_ - 2;
    if (0x55555555 < corner.value_ * -0x55555555 + 0xaaaaaaab) {
      local_3c[1] = corner.value_ + 1;
    }
    if (corner.value_ * -0x55555555 < 0x55555556) {
      local_3c[2] = corner.value_ + 2;
    }
    else {
      local_3c[2] = corner.value_ - 1;
    }
  }
  uVar3 = corner.value_ / 3;
  if (corner.value_ == 0xffffffff) {
    uVar3 = 0xffffffff;
  }
  puVar1 = (this->visited_faces_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar3 >> 6);
  *puVar1 = *puVar1 | 1L << ((byte)uVar3 & 0x3f);
  lVar7 = 0;
  do {
    uVar3 = local_3c[lVar7];
    if (((((ulong)uVar3 != 0xffffffff) &&
         (uVar6 = *(uint *)(*(long *)&(((this->corner_table_)._M_t.
                                        super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                        .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                       _M_head_impl)->opposite_corners_).vector_.
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                           + (ulong)uVar3 * 4), uVar6 != 0xffffffff)) &&
        ((*(ulong *)((long)(this->visited_faces_).super__Bvector_base<std::allocator<bool>_>._M_impl
                           .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                    (ulong)(uVar6 / 0x18 & 0xfffffff8)) >> ((ulong)uVar6 / 3 & 0x3f) & 1) == 0)) &&
       (pAVar2 = (this->attribute_data_).
                 super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (this->attribute_data_).
       super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData>_>
       ._M_impl.super__Vector_impl_data._M_finish != pAVar2)) {
      uVar6 = 1;
      uVar4 = 0;
      do {
        RAnsBitEncoder::EncodeBit
                  ((this->traversal_encoder_).attribute_connectivity_encoders_._M_t.
                   super___uniq_ptr_impl<draco::RAnsBitEncoder,_std::default_delete<draco::RAnsBitEncoder[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_draco::RAnsBitEncoder_*,_std::default_delete<draco::RAnsBitEncoder[]>_>
                   .super__Head_base<0UL,_draco::RAnsBitEncoder_*,_false>._M_head_impl +
                   (int)(uVar6 - 1),
                   (*(ulong *)(*(long *)&pAVar2[uVar4].connectivity_data.is_edge_on_seam_.
                                         super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_start.super__Bit_iterator_base
                              + (ulong)(uVar3 >> 6) * 8) & 1L << ((byte)uVar3 & 0x3f)) != 0);
        uVar4 = (ulong)uVar6;
        pAVar2 = (this->attribute_data_).
                 super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = ((long)(this->attribute_data_).
                       super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2 >> 4) *
                -0x79435e50d79435e5;
        uVar6 = uVar6 + 1;
      } while (uVar4 <= uVar5 && uVar5 - uVar4 != 0);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  return true;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<
    TraversalEncoder>::EncodeAttributeConnectivitiesOnFace(CornerIndex corner) {
  // Three corners of the face.
  const CornerIndex corners[3] = {corner, corner_table_->Next(corner),
                                  corner_table_->Previous(corner)};

  const FaceIndex src_face_id = corner_table_->Face(corner);
  visited_faces_[src_face_id.value()] = true;
  for (int c = 0; c < 3; ++c) {
    const CornerIndex opp_corner = corner_table_->Opposite(corners[c]);
    if (opp_corner == kInvalidCornerIndex) {
      continue;  // Don't encode attribute seams on boundary edges.
    }
    const FaceIndex opp_face_id = corner_table_->Face(opp_corner);
    // Don't encode edges when the opposite face has been already processed.
    if (visited_faces_[opp_face_id.value()]) {
      continue;
    }

    for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
      if (attribute_data_[i].connectivity_data.IsCornerOppositeToSeamEdge(
              corners[c])) {
        traversal_encoder_.EncodeAttributeSeam(i, true);
      } else {
        traversal_encoder_.EncodeAttributeSeam(i, false);
      }
    }
  }
  return true;
}